

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void glfwGetMonitorPos(GLFWmonitor *handle,int *xpos,int *ypos)

{
  XRRScreenResources *pXVar1;
  XRRCrtcInfo *pXVar2;
  _GLFWmonitor *monitor;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((_glfw.x11.randr.available != 0) && (_glfw.x11.randr.monitorBroken == 0)) {
    pXVar1 = (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    pXVar2 = (*_glfw.x11.randr.GetCrtcInfo)(_glfw.x11.display,pXVar1,*(RRCrtc *)(handle + 0x90));
    if (pXVar2 != (XRRCrtcInfo *)0x0) {
      if (xpos != (int *)0x0) {
        *xpos = pXVar2->x;
      }
      if (ypos != (int *)0x0) {
        *ypos = pXVar2->y;
      }
      (*_glfw.x11.randr.FreeCrtcInfo)(pXVar2);
    }
    (*_glfw.x11.randr.FreeScreenResources)(pXVar1);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPos(GLFWmonitor* handle, int* xpos, int* ypos)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorPos(monitor, xpos, ypos);
}